

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool decodeImmediateSize(char **encoding,MipsImmediateType *dest)

{
  bool bVar1;
  int local_24;
  int num;
  MipsImmediateType *dest_local;
  char **encoding_local;
  
  if (**encoding == 'h') {
    *encoding = *encoding + 1;
    *dest = ImmediateHalfFloat;
  }
  else {
    local_24 = 0;
    while( true ) {
      bVar1 = false;
      if ('/' < **encoding) {
        bVar1 = **encoding < ':';
      }
      if (!bVar1) break;
      local_24 = local_24 * 10 + (int)**encoding + -0x30;
      *encoding = *encoding + 1;
    }
    switch(local_24) {
    case 5:
      *dest = Immediate5;
      break;
    default:
      return false;
    case 7:
      *dest = Immediate7;
      break;
    case 10:
      *dest = Immediate10;
      break;
    case 0x10:
      *dest = Immediate16;
      break;
    case 0x14:
      *dest = Immediate20;
      break;
    case 0x19:
      *dest = Immediate25;
      break;
    case 0x1a:
      *dest = Immediate26;
    }
  }
  return true;
}

Assistant:

static bool decodeImmediateSize(const char*& encoding, MipsImmediateType& dest)
{
	if (*encoding == 'h')	// half float
	{
		encoding++;
		dest = MipsImmediateType::ImmediateHalfFloat;
	} else {
		int num = 0;
		while (*encoding >= '0' && *encoding <= '9')
		{
			num = num*10 + *encoding-'0';
			encoding++;
		}

		switch (num)
		{
		case 5:
			dest = MipsImmediateType::Immediate5;
			break;
		case 7:
			dest = MipsImmediateType::Immediate7;
			break;
		case 10:
			dest = MipsImmediateType::Immediate10;
			break;
		case 16:
			dest = MipsImmediateType::Immediate16;
			break;
		case 20:
			dest = MipsImmediateType::Immediate20;
			break;
		case 25:
			dest = MipsImmediateType::Immediate25;
			break;
		case 26:
			dest = MipsImmediateType::Immediate26;
			break;
		default:
			return false;
		}
	}

	return true;
}